

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O0

void __thiscall
btConvexConvexAlgorithm::btConvexConvexAlgorithm
          (btConvexConvexAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btVoronoiSimplexSolver *simplexSolver,
          btConvexPenetrationDepthSolver *pdSolver,int numPerturbationIterations,
          int minimumPointsPerturbationThreshold)

{
  btActivatingCollisionAlgorithm *in_RCX;
  btCollisionObjectWrapper *in_RSI;
  btCollisionObjectWrapper *in_RDI;
  btCollisionAlgorithmConstructionInfo *in_R8;
  btCollisionObject *in_R9;
  
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (in_RCX,in_R8,(btCollisionObjectWrapper *)in_R9,in_RDI);
  in_RDI->m_parent = (btCollisionObjectWrapper *)&PTR__btConvexConvexAlgorithm_002e31e0;
  in_RDI->m_collisionObject = in_R9;
  in_RDI->m_worldTransform = (btTransform *)simplexSolver;
  *(undefined1 *)&in_RDI->m_partId = 0;
  in_RDI[1].m_parent = in_RSI;
  *(undefined1 *)&in_RDI[1].m_shape = 0;
  *(undefined4 *)((long)&in_RDI[1].m_shape + 4) = body1Wrap._0_4_;
  *(undefined4 *)&in_RDI[1].m_collisionObject = body0Wrap._0_4_;
  return;
}

Assistant:

btConvexConvexAlgorithm::btConvexConvexAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,btSimplexSolverInterface* simplexSolver, btConvexPenetrationDepthSolver* pdSolver,int numPerturbationIterations, int minimumPointsPerturbationThreshold)
: btActivatingCollisionAlgorithm(ci,body0Wrap,body1Wrap),
m_simplexSolver(simplexSolver),
m_pdSolver(pdSolver),
m_ownManifold (false),
m_manifoldPtr(mf),
m_lowLevelOfDetail(false),
#ifdef USE_SEPDISTANCE_UTIL2
m_sepDistance((static_cast<btConvexShape*>(body0->getCollisionShape()))->getAngularMotionDisc(),
			  (static_cast<btConvexShape*>(body1->getCollisionShape()))->getAngularMotionDisc()),
#endif
m_numPerturbationIterations(numPerturbationIterations),
m_minimumPointsPerturbationThreshold(minimumPointsPerturbationThreshold)
{
	(void)body0Wrap;
	(void)body1Wrap;
}